

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_add.cxx
# Opt level: O2

Fl_Menu_Item * array_insert(Fl_Menu_Item *array,int size,int n,char *text,int flags)

{
  Fl_Menu_Item *pFVar1;
  undefined1 auVar2 [16];
  Fl_Menu_Item *pFVar3;
  Fl_Menu_Item *__dest;
  char *pcVar4;
  ulong uVar5;
  
  pFVar1 = local_array;
  __dest = array;
  pFVar3 = local_array;
  if ((local_array == array) && (local_array_alloc <= size)) {
    local_array_alloc = size * 2;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)local_array_alloc;
    uVar5 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x38),8) == 0) {
      uVar5 = SUB168(auVar2 * ZEXT816(0x38),0);
    }
    __dest = (Fl_Menu_Item *)operator_new__(uVar5);
    memcpy(__dest,array,(long)size * 0x38);
    pFVar3 = __dest;
    if (array != (Fl_Menu_Item *)0x0) {
      operator_delete__(pFVar1);
    }
  }
  local_array = pFVar3;
  pFVar1 = __dest + n;
  memmove(__dest + (long)n + 1,pFVar1,(long)(size - n) * 0x38);
  if (text == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = strdup(text);
  }
  pFVar1->text = pcVar4;
  pFVar1->shortcut_ = 0;
  pFVar1->callback_ = (Fl_Callback *)0x0;
  pFVar1->user_data_ = (void *)0x0;
  pFVar1->flags = flags;
  pFVar1->labelcolor_ = 0;
  pFVar1->labeltype_ = '\0';
  pFVar1->labelfont_ = 0;
  pFVar1->labelsize_ = 0;
  return __dest;
}

Assistant:

static Fl_Menu_Item* array_insert(
  Fl_Menu_Item* array,  // array to modify
  int size,             // size of array
  int n,                // index of new insert position
  const char *text,     // text of new item (copy is made)
  int flags             // flags for new item
) {
  if (array == local_array && size >= local_array_alloc) {
    local_array_alloc = 2*size;
    Fl_Menu_Item* newarray = new Fl_Menu_Item[local_array_alloc];
    memmove(newarray, array, size*sizeof(Fl_Menu_Item));
    delete[] local_array;
    local_array = array = newarray;
  }
  // move all the later items:
  memmove(array+n+1, array+n, sizeof(Fl_Menu_Item)*(size-n));
  // create the new item:
  Fl_Menu_Item* m = array+n;
  m->text = text ? strdup(text) : 0;
  m->shortcut_ = 0;
  m->callback_ = 0;
  m->user_data_ = 0;
  m->flags = flags;
  m->labeltype_ = m->labelsize_ = m->labelcolor_ = 0;
  m->labelfont_ = FL_HELVETICA; 
  return array;
}